

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType::IfcBuildingElementProxyType
          (IfcBuildingElementProxyType *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_00806870;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcBuildingElementProxyType";
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__008b2d90);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>).
  aux_is_derived.super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x8b2c60;
  *(undefined8 *)&this->field_0x1c0 = 0x8b2d78;
  *(undefined8 *)&this->field_0x88 = 0x8b2c88;
  *(undefined8 *)&this->field_0x98 = 0x8b2cb0;
  *(undefined8 *)&this->field_0xf0 = 0x8b2cd8;
  *(undefined8 *)&this->field_0x148 = 0x8b2d00;
  *(undefined8 *)&this->field_0x180 = 0x8b2d28;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>).
  _vptr_ObjectHelper = (_func_int **)0x8b2d50;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>).field_0x10
       = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>).
          field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>).field_0x18
       = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>).field_0x20 =
       0;
  return;
}

Assistant:

IfcBuildingElementProxyType() : Object("IfcBuildingElementProxyType") {}